

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamAntennaPattern.cpp
# Opt level: O1

void __thiscall DIS::BeamAntennaPattern::unmarshal(BeamAntennaPattern *this,DataStream *dataStream)

{
  EulerAngles::unmarshal(&this->_beamDirection,dataStream);
  DataStream::operator>>(dataStream,&this->_azimuthBeamwidth);
  DataStream::operator>>(dataStream,&this->_elevationBeamwidth);
  DataStream::operator>>(dataStream,&this->_referenceSystem);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_padding2);
  DataStream::operator>>(dataStream,&this->_ez);
  DataStream::operator>>(dataStream,&this->_ex);
  DataStream::operator>>(dataStream,&this->_phase);
  DataStream::operator>>(dataStream,&this->_padding3);
  return;
}

Assistant:

void BeamAntennaPattern::unmarshal(DataStream& dataStream)
{
    _beamDirection.unmarshal(dataStream);
    dataStream >> _azimuthBeamwidth;
    dataStream >> _elevationBeamwidth;
    dataStream >> _referenceSystem;
    dataStream >> _padding1;
    dataStream >> _padding2;
    dataStream >> _ez;
    dataStream >> _ex;
    dataStream >> _phase;
    dataStream >> _padding3;
}